

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::UpdateWindowParentAndRootLinks
               (ImGuiWindow *window,ImGuiWindowFlags flags,ImGuiWindow *parent_window)

{
  ImGuiWindow *pIVar1;
  
  window->ParentWindow = parent_window;
  window->RootWindowForNav = window;
  window->RootWindowForTitleBarHighlight = window;
  window->RootWindowPopupTree = window;
  window->RootWindow = window;
  if ((flags & 0x3000000U) == 0x1000000 && parent_window != (ImGuiWindow *)0x0) {
    window->RootWindow = parent_window->RootWindow;
  }
  if (((uint)flags >> 0x1a & 1) != 0 && parent_window != (ImGuiWindow *)0x0) {
    window->RootWindowPopupTree = parent_window->RootWindowPopupTree;
  }
  if (((parent_window != (ImGuiWindow *)0x0) && ((flags & 0x8000000U) == 0)) &&
     ((flags & 0x5000000U) != 0)) {
    window->RootWindowForTitleBarHighlight = parent_window->RootWindowForTitleBarHighlight;
  }
  pIVar1 = window;
  if ((window->ChildFlags & 0x100) != 0) {
    do {
      pIVar1 = pIVar1->ParentWindow;
    } while ((pIVar1->ChildFlags & 0x100) != 0);
    window->RootWindowForNav = pIVar1;
  }
  return;
}

Assistant:

void ImGui::UpdateWindowParentAndRootLinks(ImGuiWindow* window, ImGuiWindowFlags flags, ImGuiWindow* parent_window)
{
    window->ParentWindow = parent_window;
    window->RootWindow = window->RootWindowPopupTree = window->RootWindowForTitleBarHighlight = window->RootWindowForNav = window;
    if (parent_window && (flags & ImGuiWindowFlags_ChildWindow) && !(flags & ImGuiWindowFlags_Tooltip))
        window->RootWindow = parent_window->RootWindow;
    if (parent_window && (flags & ImGuiWindowFlags_Popup))
        window->RootWindowPopupTree = parent_window->RootWindowPopupTree;
    if (parent_window && !(flags & ImGuiWindowFlags_Modal) && (flags & (ImGuiWindowFlags_ChildWindow | ImGuiWindowFlags_Popup)))
        window->RootWindowForTitleBarHighlight = parent_window->RootWindowForTitleBarHighlight;
    while (window->RootWindowForNav->ChildFlags & ImGuiChildFlags_NavFlattened)
    {
        IM_ASSERT(window->RootWindowForNav->ParentWindow != NULL);
        window->RootWindowForNav = window->RootWindowForNav->ParentWindow;
    }
}